

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall wallet::LegacyScriptPubKeyMan::UpgradeKeyMetadata(LegacyScriptPubKeyMan *this)

{
  Span<const_std::byte> seed;
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  reference keypath_str;
  uchar *__first;
  runtime_error *this_00;
  CExtKey *in_RDI;
  long in_FS_OFFSET;
  CKeyMetadata *meta;
  pair<const_CKeyID,_wallet::CKeyMetadata> *meta_pair;
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  *__range1;
  CKey key;
  iterator __end1;
  iterator __begin1;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  CPubKey pubkey;
  CKeyID master_id;
  CExtKey masterKey;
  CExtKey *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  byte in_stack_fffffffffffffe57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 overwrite;
  WalletDatabase *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  CKeyMetadata *meta_00;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe88;
  CKeyMetadata *keypath;
  undefined4 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec4 [12];
  CKeyMetadata local_118 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe88,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffe87,
                      CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
             in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0));
  bVar1 = (**(code **)(**(long **)&in_RDI->nChild + 0x50))();
  if (((bVar1 & 1) == 0) &&
     (bVar1 = (**(code **)(**(long **)&in_RDI->nChild + 0x20))(*(long **)&in_RDI->nChild,2),
     (bVar1 & 1) == 0)) {
    (**(code **)(**(long **)&in_RDI->nChild + 0x18))();
    std::make_unique<wallet::WalletBatch,wallet::WalletDatabase&>(in_stack_fffffffffffffe70);
    local_118[0].hdKeypath._M_string_length =
         (size_type)
         std::
         map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
         ::begin((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    local_118[0].hdKeypath._M_dataplus._M_p =
         (pointer)std::
                  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                  ::end((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                         *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe58,
                                   (_Self *)CONCAT17(in_stack_fffffffffffffe57,
                                                     in_stack_fffffffffffffe50)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      keypath_str = std::_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>::
                    operator*((_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_> *)
                              in_stack_fffffffffffffe48);
      keypath = &keypath_str->second;
      uVar3 = base_blob<160U>::IsNull((base_blob<160U> *)in_stack_fffffffffffffe58);
      if (((!(bool)uVar3) && ((keypath->has_key_origin & 1U) == 0)) &&
         (uVar4 = std::operator==(in_stack_fffffffffffffe58,
                                  (char *)CONCAT17(in_stack_fffffffffffffe57,
                                                   in_stack_fffffffffffffe50)),
         ((uVar4 ^ 0xff) & 1) != 0)) {
        meta_00 = local_118;
        CKey::CKey((CKey *)in_stack_fffffffffffffe48);
        (**(code **)(*(long *)in_RDI + 0xf0))(in_RDI,&keypath->hd_seed_id,meta_00);
        CExtKey::CExtKey(in_stack_fffffffffffffe48);
        Span<const_std::byte>::Span<CKey>
                  ((Span<const_std::byte> *)in_stack_fffffffffffffe58,
                   (CKey *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe48);
        seed._4_12_ = in_stack_fffffffffffffec4;
        seed.m_data._0_4_ = in_stack_fffffffffffffec0;
        CExtKey::SetSeed(in_RDI,seed);
        CKey::GetPubKey((CKey *)in_stack_fffffffffffffe70);
        CPubKey::GetID((CPubKey *)in_stack_fffffffffffffe70);
        in_stack_fffffffffffffe70 =
             (WalletDatabase *)base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffffe48);
        __first = base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffffe48);
        std::copy<unsigned_char*,unsigned_char*>
                  (__first,(uchar *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                   (uchar *)in_stack_fffffffffffffe58);
        overwrite = (undefined1)((ulong)__first >> 0x38);
        in_stack_fffffffffffffe67 =
             ParseHDKeypath((string *)keypath_str,
                            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)keypath);
        if (!(bool)in_stack_fffffffffffffe67) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Invalid stored hdKeypath");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00a15d9c;
        }
        keypath->has_key_origin = true;
        if (keypath->nVersion < 0xc) {
          keypath->nVersion = 0xc;
        }
        CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe57 =
             (**(code **)(*(long *)in_RDI + 0xf8))
                       (in_RDI,keypath_str,
                        (uchar *)((long)local_118[0].hd_seed_id.super_uint160.super_base_blob<160U>.
                                        m_data._M_elems + 10));
        if ((in_stack_fffffffffffffe57 & 1) != 0) {
          std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::
          operator->((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
                     in_stack_fffffffffffffe48);
          WalletBatch::WriteKeyMetadata
                    ((WalletBatch *)CONCAT17(uVar3,CONCAT16(uVar4,in_stack_fffffffffffffe80)),
                     meta_00,(CPubKey *)in_stack_fffffffffffffe70,(bool)overwrite);
        }
        CExtKey::~CExtKey(in_stack_fffffffffffffe48);
        CKey::~CKey((CKey *)in_stack_fffffffffffffe48);
      }
      std::_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_> *)
                 in_stack_fffffffffffffe48);
    }
    _GLOBAL__N_1::std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::
    ~unique_ptr((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
                in_stack_fffffffffffffe58);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00a15d9c:
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::UpgradeKeyMetadata()
{
    LOCK(cs_KeyStore);
    if (m_storage.IsLocked() || m_storage.IsWalletFlagSet(WALLET_FLAG_KEY_ORIGIN_METADATA)) {
        return;
    }

    std::unique_ptr<WalletBatch> batch = std::make_unique<WalletBatch>(m_storage.GetDatabase());
    for (auto& meta_pair : mapKeyMetadata) {
        CKeyMetadata& meta = meta_pair.second;
        if (!meta.hd_seed_id.IsNull() && !meta.has_key_origin && meta.hdKeypath != "s") { // If the hdKeypath is "s", that's the seed and it doesn't have a key origin
            CKey key;
            GetKey(meta.hd_seed_id, key);
            CExtKey masterKey;
            masterKey.SetSeed(key);
            // Add to map
            CKeyID master_id = masterKey.key.GetPubKey().GetID();
            std::copy(master_id.begin(), master_id.begin() + 4, meta.key_origin.fingerprint);
            if (!ParseHDKeypath(meta.hdKeypath, meta.key_origin.path)) {
                throw std::runtime_error("Invalid stored hdKeypath");
            }
            meta.has_key_origin = true;
            if (meta.nVersion < CKeyMetadata::VERSION_WITH_KEY_ORIGIN) {
                meta.nVersion = CKeyMetadata::VERSION_WITH_KEY_ORIGIN;
            }

            // Write meta to wallet
            CPubKey pubkey;
            if (GetPubKey(meta_pair.first, pubkey)) {
                batch->WriteKeyMetadata(meta, pubkey, true);
            }
        }
    }
}